

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.h
# Opt level: O2

int can_ipv6(void)

{
  int iVar1;
  short *psVar2;
  long lVar3;
  uint uVar4;
  int count;
  uv_interface_address_t *addr;
  int local_14;
  long local_10;
  
  iVar1 = uv_interface_addresses(&local_10,&local_14);
  uVar4 = 0;
  if (iVar1 == 0) {
    psVar2 = (short *)(local_10 + 0x14);
    uVar4 = 0;
    for (lVar3 = 0; (uVar4 == 0 && (lVar3 < local_14)); lVar3 = lVar3 + 1) {
      uVar4 = (uint)(*psVar2 == 10);
      psVar2 = psVar2 + 0x30;
    }
    uv_free_interface_addresses();
  }
  return uVar4;
}

Assistant:

UNUSED static int can_ipv6(void) {
  uv_interface_address_t* addr;
  int supported;
  int count;
  int i;

  if (uv_interface_addresses(&addr, &count))
    return 0;  /* Assume no IPv6 support on failure. */

  supported = 0;
  for (i = 0; supported == 0 && i < count; i += 1)
    supported = (AF_INET6 == addr[i].address.address6.sin6_family);

  uv_free_interface_addresses(addr, count);
  return supported;
}